

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_PlaySpawnSound
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *spawner;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  char *pcVar4;
  AActor *missile;
  bool bVar5;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      spawner = (AActor *)(param->field_0).field_1.a;
      if (spawner != (AActor *)0x0) {
        if ((spawner->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(spawner->super_DThinker).super_DObject._vptr_DObject)(spawner);
          (spawner->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (spawner->super_DThinker).super_DObject.Class;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004302e8;
        }
      }
      if (numparam == 1) {
        pcVar4 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          missile = (AActor *)param[1].field_0.field_1.a;
          if (missile == (AActor *)0x0) {
            NullParam("\"missile\"");
            missile = (AActor *)param[1].field_0.field_1.a;
          }
          pPVar1 = AActor::RegistrationInfo.MyClass;
          if (missile != (AActor *)0x0) {
            if ((missile->super_DThinker).super_DObject.Class == (PClass *)0x0) {
              iVar2 = (**(missile->super_DThinker).super_DObject._vptr_DObject)(missile);
              (missile->super_DThinker).super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var_00,iVar2);
            }
            pPVar3 = (missile->super_DThinker).super_DObject.Class;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 != pPVar1 && bVar5) {
              do {
                pPVar3 = pPVar3->ParentClass;
                bVar5 = pPVar3 != (PClass *)0x0;
                if (pPVar3 == pPVar1) break;
              } while (pPVar3 != (PClass *)0x0);
            }
            if (!bVar5) {
              pcVar4 = "missile == NULL || missile->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00430307;
            }
          }
          P_PlaySpawnSound(missile,spawner);
          return 0;
        }
        pcVar4 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_00430307:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x18f7,
                    "int AF_AActor_PlaySpawnSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_004302e8:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x18f6,
                "int AF_AActor_PlaySpawnSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, PlaySpawnSound)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(missile, AActor);
	P_PlaySpawnSound(missile, self);
	return 0;
}